

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::GetTargetSets
          (cmGlobalGenerator *this,TargetDependSet *projectTargets,TargetDependSet *originalTargets,
          cmLocalGenerator *root,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *generators)

{
  pointer ppcVar1;
  pointer puVar2;
  bool bVar3;
  pointer ppcVar4;
  cmLocalGenerator *pcVar5;
  pointer puVar6;
  cmGeneratorTarget *this_00;
  cmTargetDepend local_50;
  
  ppcVar4 = (generators->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppcVar1 = (generators->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  this_00 = (cmGeneratorTarget *)this;
  do {
    if (ppcVar4 == ppcVar1) {
      return;
    }
    pcVar5 = *ppcVar4;
    bVar3 = IsExcluded((cmGlobalGenerator *)this_00,root,pcVar5);
    if (!bVar3) {
      puVar2 = (pcVar5->GeneratorTargets).
               super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar6 = (pcVar5->GeneratorTargets).
                    super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1
          ) {
        bVar3 = IsRootOnlyTarget(this,(puVar6->_M_t).
                                      super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                      .super__Head_base<0UL,_cmGeneratorTarget_*,_false>.
                                      _M_head_impl);
        if (bVar3) {
          this_00 = (puVar6->_M_t).
                    super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                    .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
          pcVar5 = cmGeneratorTarget::GetLocalGenerator(this_00);
          if (pcVar5 == root) goto LAB_00200620;
        }
        else {
LAB_00200620:
          cmTargetDepend::cmTargetDepend
                    (&local_50,
                     (puVar6->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          std::
          _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
          ::_M_insert_unique<cmTargetDepend>
                    ((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                      *)originalTargets,&local_50);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_50.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          this_00 = (cmGeneratorTarget *)this;
          AddTargetDepends(this,(puVar6->_M_t).
                                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                           projectTargets);
        }
      }
    }
    ppcVar4 = ppcVar4 + 1;
  } while( true );
}

Assistant:

void cmGlobalGenerator::GetTargetSets(
  TargetDependSet& projectTargets, TargetDependSet& originalTargets,
  cmLocalGenerator* root, std::vector<cmLocalGenerator*>& generators)
{
  // loop over all local generators
  for (auto* generator : generators) {
    // check to make sure generator is not excluded
    if (this->IsExcluded(root, generator)) {
      continue;
    }
    // loop over all the generator targets in the makefile
    for (const auto& target : generator->GetGeneratorTargets()) {
      if (this->IsRootOnlyTarget(target.get()) &&
          target->GetLocalGenerator() != root) {
        continue;
      }
      // put the target in the set of original targets
      originalTargets.insert(target.get());
      // Get the set of targets that depend on target
      this->AddTargetDepends(target.get(), projectTargets);
    }
  }
}